

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  TestPartResult *pTVar1;
  ostream *poVar2;
  uint line;
  internal *piVar3;
  char *pcVar4;
  int i;
  int local_cc;
  int local_c8;
  allocator<char> local_c1;
  ostream *local_c0;
  TestResult *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string summary;
  string location;
  string detail;
  
  local_cc = 0;
  local_c8 = 0;
  local_c0 = stream;
  local_b8 = result;
  for (i = 0; i < (int)(((long)(result->test_part_results_).
                               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x70); i = i + 1) {
    pTVar1 = TestResult::GetTestPartResult(result,i);
    line = pTVar1->type_ - kNonFatalFailure;
    if (line < 2) {
      if (local_c8 == 0 && local_cc == 0) {
        std::operator<<(stream,">\n");
      }
      piVar3 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar3 != (internal *)0x0) {
        piVar3 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar3,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar1->summary_)._M_dataplus._M_p);
      poVar2 = local_c0;
      std::__cxx11::string::~string((string *)&detail);
      poVar2 = std::operator<<(poVar2,"      <failure message=\"");
      EscapeXmlAttribute(&detail,&summary);
      poVar2 = std::operator<<(poVar2,(string *)&detail);
      std::operator<<(poVar2,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::operator+(&local_b0,&location,"\n");
      std::operator+(&detail,&local_b0,(pTVar1->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_b0);
      RemoveInvalidXmlCharacters(&local_b0,&detail);
      result = local_b8;
      stream = local_c0;
      OutputXmlCDataSection(local_c0,local_b0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator<<(stream,"</failure>\n");
      local_c8 = local_c8 + 1;
LAB_00141ab1:
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
    else if (pTVar1->type_ == kSkip) {
      if (local_cc == 0 && local_c8 == 0) {
        std::operator<<(stream,">\n");
      }
      piVar3 = (internal *)(pTVar1->file_name_)._M_string_length;
      if (piVar3 != (internal *)0x0) {
        piVar3 = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,piVar3,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar1->summary_)._M_dataplus._M_p);
      poVar2 = local_c0;
      std::__cxx11::string::~string((string *)&detail);
      poVar2 = std::operator<<(poVar2,"      <skipped message=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,summary._M_dataplus._M_p,&local_c1);
      EscapeXmlAttribute(&detail,&local_b0);
      poVar2 = std::operator<<(poVar2,(string *)&detail);
      std::operator<<(poVar2,"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_b0,&location,"\n");
      std::operator+(&detail,&local_b0,(pTVar1->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_b0);
      RemoveInvalidXmlCharacters(&local_b0,&detail);
      result = local_b8;
      stream = local_c0;
      OutputXmlCDataSection(local_c0,local_b0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator<<(stream,"</skipped>\n");
      local_cc = local_cc + 1;
      goto LAB_00141ab1;
    }
  }
  if (local_c8 == 0 && local_cc == 0) {
    if ((int)((ulong)((long)(result->test_properties_).
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(result->test_properties_).
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) == 0) {
      pcVar4 = " />\n";
      goto LAB_00141b10;
    }
    std::operator<<(stream,">\n");
  }
  OutputXmlTestProperties(stream,result);
  pcVar4 = "    </testcase>\n";
LAB_00141b10:
  std::operator<<(stream,pcVar4);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}